

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseF32(WastParser *this,Const *const_,ConstType const_type)

{
  LiteralType literal_type;
  Literal *pLVar1;
  const_iterator s;
  const_iterator end;
  bool local_8d;
  uint32_t local_8c;
  undefined1 local_88 [4];
  uint32_t f32_bits;
  undefined8 local_48;
  Literal literal;
  ExpectedNan local_28;
  ConstType local_24;
  ExpectedNan expected;
  ConstType const_type_local;
  Const *const__local;
  WastParser *this_local;
  Result result;
  
  local_8d = false;
  local_24 = const_type;
  _expected = const_;
  const__local = (Const *)this;
  if (const_type == Expectation) {
    literal.text.size_._4_4_ = ParseExpectedNan(this,&local_28);
    local_8d = Succeeded(literal.text.size_._4_4_);
  }
  if (local_8d == false) {
    Consume((Token *)local_88,this);
    pLVar1 = Token::literal((Token *)local_88);
    local_48 = *(undefined8 *)pLVar1;
    literal._0_8_ = (pLVar1->text).data_;
    literal.text.data_ = (char *)(pLVar1->text).size_;
    literal_type = (LiteralType)local_48;
    s = string_view::begin((string_view *)&literal);
    end = string_view::end((string_view *)&literal);
    this_local._4_4_ = ParseFloat(literal_type,s,end,&local_8c);
    Const::set_f32(_expected,local_8c);
  }
  else {
    Const::set_f32(_expected,local_28);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseF32(Const* const_, ConstType const_type) {
  ExpectedNan expected;
  if (const_type == ConstType::Expectation &&
      Succeeded(ParseExpectedNan(&expected))) {
    const_->set_f32(expected);
    return Result::Ok;
  }
  auto literal = Consume().literal();
  uint32_t f32_bits;
  Result result = ParseFloat(literal.type, literal.text.begin(),
                             literal.text.end(), &f32_bits);
  const_->set_f32(f32_bits);
  return result;
}